

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

size_t __thiscall
httplib::detail::MultipartFormDataParser::buf_find(MultipartFormDataParser *this,string *s)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  size_t sVar4;
  ulong uVar5;
  size_t remaining_size;
  size_t pos;
  size_t off;
  value_type c;
  string *s_local;
  MultipartFormDataParser *this_local;
  
  pcVar3 = (char *)std::__cxx11::string::front();
  cVar1 = *pcVar3;
  pos = this->buf_spos_;
  while( true ) {
    if (this->buf_epos_ <= pos) {
      sVar4 = buf_size(this);
      return sVar4;
    }
    remaining_size = pos;
    while( true ) {
      if (remaining_size == this->buf_epos_) {
        sVar4 = buf_size(this);
        return sVar4;
      }
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&this->buf_);
      if (*pcVar3 == cVar1) break;
      remaining_size = remaining_size + 1;
    }
    sVar4 = this->buf_epos_;
    uVar5 = std::__cxx11::string::size();
    if (sVar4 - remaining_size < uVar5) break;
    bVar2 = start_with(this,&this->buf_,remaining_size,this->buf_epos_,s);
    if (bVar2) {
      return remaining_size - this->buf_spos_;
    }
    pos = remaining_size + 1;
  }
  sVar4 = buf_size(this);
  return sVar4;
}

Assistant:

size_t buf_find(const std::string &s) const {
    auto c = s.front();

    size_t off = buf_spos_;
    while (off < buf_epos_) {
      auto pos = off;
      while (true) {
        if (pos == buf_epos_) { return buf_size(); }
        if (buf_[pos] == c) { break; }
        pos++;
      }

      auto remaining_size = buf_epos_ - pos;
      if (s.size() > remaining_size) { return buf_size(); }

      if (start_with(buf_, pos, buf_epos_, s)) { return pos - buf_spos_; }

      off = pos + 1;
    }

    return buf_size();
  }